

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

Literal * __thiscall
wasm::ShellExternalInterface::tableLoad
          (Literal *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,Address index
          )

{
  bool bVar1;
  pointer ppVar2;
  address64_t aVar3;
  size_type sVar4;
  reference pvVar5;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *table;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
  local_38;
  iterator it;
  ShellExternalInterface *this_local;
  Address index_local;
  Name tableName_local;
  
  index_local.addr = tableName.super_IString.str._M_len;
  it.
  super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
               )this;
  this_local = (ShellExternalInterface *)index.addr;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>_>
       ::find(&this->tables,(key_type *)&index_local);
  table = (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
          std::
          unordered_map<wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>_>
          ::end(&this->tables);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                      *)&table);
  if (bVar1) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"tableGet on non-existing table");
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_false,_true>
                         *)&local_38);
  aVar3 = Address::operator_cast_to_unsigned_long((Address *)&this_local);
  sVar4 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::size(&ppVar2->second);
  if (sVar4 <= aVar3) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])(this,"out of bounds table access")
    ;
  }
  aVar3 = Address::operator_cast_to_unsigned_long((Address *)&this_local);
  pvVar5 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                     (&ppVar2->second,aVar3);
  ::wasm::Literal::Literal(__return_storage_ptr__,pvVar5);
  return __return_storage_ptr__;
}

Assistant:

Literal tableLoad(Name tableName, Address index) override {
    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("tableGet on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("out of bounds table access");
    }

    return table[index];
  }